

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O2

void SplitTree(QuadTreeNode *Tree)

{
  Triangle *pTVar1;
  Container **ppCVar2;
  Container *pCVar3;
  Container *pCVar4;
  Container *pCVar5;
  Container *pCVar6;
  Container *pCVar7;
  Container *pCVar8;
  uint uVar9;
  long lVar10;
  
  if (Tree->Children == (QuadTreeNode *)0x0) {
    pCVar5 = Tree->Contents;
    if (pCVar5 != (Container *)0x0) {
      Tree->Contents = (Container *)0x0;
      Tree->PostContents = (Container *)0x0;
      pCVar6 = (Container *)0x0;
      pCVar7 = (Container *)0x0;
      while (pCVar5 != (Container *)0x0) {
        pTVar1 = (pCVar5->Content).T;
        if (pCVar5->Type == OBJECT) {
          uVar9 = *(uint *)(pTVar1->Edges + 1);
        }
        else {
          uVar9 = pTVar1->EdgeFlags[1] | pTVar1->EdgeFlags[0] | pTVar1->EdgeFlags[2];
        }
        pCVar8 = pCVar7;
        ppCVar2 = &Tree->Contents;
        pCVar3 = pCVar6;
        pCVar4 = pCVar5;
        if ((uVar9 >> 9 & 1) != 0) {
          pCVar8 = pCVar5;
          ppCVar2 = &Tree->PostContents;
          pCVar3 = pCVar7;
          pCVar4 = pCVar6;
        }
        pCVar6 = pCVar4;
        pCVar7 = pCVar5->Next;
        pCVar5->Next = pCVar3;
        *ppCVar2 = pCVar5;
        pCVar5 = pCVar7;
        pCVar7 = pCVar8;
      }
    }
  }
  else {
    for (lVar10 = 0xd8; lVar10 != -0x48; lVar10 = lVar10 + -0x48) {
      SplitTree((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar10));
    }
  }
  return;
}

Assistant:

void SplitTree(struct QuadTreeNode *Tree)
{
   struct Container *P, *PNext;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         SplitTree(&Tree->Children[c]);
   } else if (Tree->Contents) {
      P = Tree->Contents;
      Tree->Contents = Tree->PostContents = NULL;

      while (P) {
         PNext = P->Next;

         if (P->Type == OBJECT) {
            if (P->Content.O->Flags & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         } else {
            if ((P->Content.T->EdgeFlags[0] | P->Content.T->
                 EdgeFlags[1] | P->Content.T->EdgeFlags[2])
                & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         }

         P = PNext;
      }
   }
}